

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O1

void __thiscall HPreData::printAR(HPreData *this,int i)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  HPreData *pHVar6;
  pointer pdVar7;
  size_t sVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  bool bVar16;
  char buff [4];
  char local_3c [4];
  ulong local_38;
  
  pHVar6 = (HPreData *)&this->numColOriginal;
  if (i == 0) {
    pHVar6 = this;
  }
  local_38 = (ulong)(uint)(&this->numRow)[i != 0];
  uVar1 = pHVar6->numCol;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
  pdVar7 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    uVar14 = 0;
    do {
      sprintf(local_3c,"%2.1g ",pdVar7[uVar14]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar8 = strlen(local_3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3c,sVar8);
      uVar14 = uVar14 + 1;
      pdVar7 = (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)((long)(this->colCost).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar7 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------AR-|-b-----\n",0x12);
  if (0 < (int)local_38) {
    uVar14 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar13 = 0;
        do {
          piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar12 = piVar3[uVar14];
          lVar10 = (long)iVar12;
          bVar16 = piVar4[lVar10] == uVar13;
          if (bVar16) {
LAB_0014cbd0:
            if (piVar3[uVar14 + 1] <= iVar12) goto LAB_0014cc17;
            sprintf(local_3c,"%2.1g ",
                    (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10]);
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar8 = strlen(local_3c);
            pcVar15 = local_3c;
          }
          else {
            iVar2 = piVar3[uVar14 + 1];
            iVar5 = iVar2;
            if (iVar2 < iVar12) {
              iVar5 = iVar12;
            }
            if (iVar12 < iVar2) {
              lVar11 = lVar10;
              do {
                iVar12 = iVar12 + 1;
                lVar10 = lVar11 + 1;
                bVar16 = piVar4[lVar11 + 1] == uVar13;
                if (bVar16) goto LAB_0014cbd0;
                lVar11 = lVar10;
              } while (iVar5 != lVar10);
            }
            iVar12 = (int)lVar10;
            if (bVar16) goto LAB_0014cbd0;
LAB_0014cc17:
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar8 = 3;
            pcVar15 = "   ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,sVar8);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |   ",6);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      poVar9 = std::ostream::_M_insert<double>
                         ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar14]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," < < ",5);
      poVar9 = std::ostream::_M_insert<double>
                         ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar14]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------l------\n",0xe);
  if (0 < (int)uVar1) {
    uVar14 = 0;
    do {
      if ((this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] <= -1e+200) {
        local_38 = local_38 & 0xffffffffffffff00;
        builtin_strncpy(local_3c,"-inf",4);
      }
      else {
        sprintf(local_3c,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar8 = strlen(local_3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3c,sVar8);
      uVar14 = uVar14 + 1;
    } while (uVar1 != uVar14);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"------u------\n",0xe);
  if (0 < (int)uVar1) {
    uVar14 = 0;
    do {
      if (1e+200 <= (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14]) {
        builtin_strncpy(local_3c,"inf",4);
      }
      else {
        sprintf(local_3c,"%2.1g ");
      }
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar8 = strlen(local_3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_3c,sVar8);
      uVar14 = uVar14 + 1;
    } while (uVar1 != uVar14);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void HPreData::printAR(int i) {
	int rows=numRow, cols=numCol;
	if (i) {
		rows = numRowOriginal;
		cols = numColOriginal;
	}

	cout<<"\n-----cost-----\n";

	char buff [4];
	for (size_t i=0;i<colCost.size();i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------AR-|-b-----\n";
	for (int i=0;i<rows;i++) {
		for (int j=0;j<cols;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1])
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff;
				}
			else cout<<std::setw(5)<<"   ";

		}
		cout<<"  |   "<<std::setw(5)<<rowLower[i]<<" < < "<<rowUpper[i]<<endl;
	}
	cout<<"------l------\n";
	for (int i=0;i<cols;i++) {
		if (colLower[i]>-HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colLower[i]);
		else
			sprintf(buff, "-inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
	cout<<"------u------\n";
	for (int i=0;i<cols;i++) {
		if (colUpper[i]<HSOL_CONST_INF)
			sprintf(buff, "%2.1g ", colUpper[i]);
		else
			sprintf(buff, "inf");
		cout<<setw(5)<<buff;
	}
	cout<<endl;
}